

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O0

int lws_plat_rawudp_broadcast(uint8_t *p,uint8_t *canned,int canned_len,int n,int fd,char *iface)

{
  uint16_t uVar1;
  uint uVar2;
  ssize_t sVar3;
  uint local_54;
  uint16_t *puStack_50;
  uint32_t ucs;
  uint16_t *p16;
  uint local_40;
  sockaddr_ll sll;
  char *iface_local;
  int fd_local;
  int n_local;
  int canned_len_local;
  uint8_t *canned_local;
  uint8_t *p_local;
  
  local_54 = 0;
  sll.sll_addr = (uchar  [8])iface;
  memcpy(p,canned,(long)canned_len);
  p[2] = (uint8_t)((uint)n >> 8);
  p[3] = (uint8_t)n;
  puStack_50 = (uint16_t *)p;
  while (puStack_50 < p + 0x14) {
    uVar1 = ntohs(*puStack_50);
    local_54 = uVar1 + local_54;
    puStack_50 = puStack_50 + 1;
  }
  uVar2 = (local_54 >> 0x10) + local_54 ^ 0xffff;
  p[10] = (uint8_t)(uVar2 >> 8);
  p[0xb] = (uint8_t)uVar2;
  p[0x18] = (uint8_t)((uint)(n + -0x14) >> 8);
  p[0x19] = (uint8_t)n + 0xec;
  memset((void *)((long)&p16 + 4),0,0x14);
  p16._4_2_ = 0x11;
  p16._6_2_ = htons(0x800);
  sll.sll_protocol._1_1_ = 6;
  local_40 = if_nametoindex((char *)sll.sll_addr);
  memset(&sll.sll_ifindex,0xff,6);
  sVar3 = sendto(fd,p,(long)n,0,(sockaddr *)((long)&p16 + 4),0x14);
  return (int)sVar3;
}

Assistant:

int
lws_plat_rawudp_broadcast(uint8_t *p, const uint8_t *canned, int canned_len,
			  int n, int fd, const char *iface)
{
#if defined(__linux__)
	struct sockaddr_ll sll;
	uint16_t *p16 = (uint16_t *)p;
	uint32_t ucs = 0;

	memcpy(p, canned, canned_len);

	p[2] = n >> 8;
	p[3] = n;

	while (p16 < (uint16_t *)(p + 20))
		ucs += ntohs(*p16++);

	ucs += ucs >> 16;
	ucs ^= 0xffff;

	p[10] = ucs >> 8;
	p[11] = ucs;
	p[24] = (n - 20) >> 8;
	p[25] = (n - 20);

	memset(&sll, 0, sizeof(sll));
	sll.sll_family = AF_PACKET;
	sll.sll_protocol = htons(0x800);
	sll.sll_halen = 6;
	sll.sll_ifindex = if_nametoindex(iface);
	memset(sll.sll_addr, 0xff, 6);

	return sendto(fd, p, n, 0, (struct sockaddr *)&sll, sizeof(sll));
#else
	lwsl_err("%s: UNIMPLEMENTED on this platform\n", __func__);

	return -1;
#endif
}